

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O3

void CtoE(Clifford *p)

{
  float tv;
  vector<Blade,_std::allocator<Blade>_> local_108;
  vector<Blade,_std::allocator<Blade>_> local_f0;
  vector<Blade,_std::allocator<Blade>_> local_d8;
  Clifford local_c0;
  Clifford local_a8;
  vector<Blade,_std::allocator<Blade>_> local_90;
  vector<Blade,_std::allocator<Blade>_> local_78;
  Clifford local_60;
  Clifford local_48;
  vector<Blade,_std::allocator<Blade>_> local_28;
  
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_78,p);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_90,&e);
  operator|(&local_60,&local_78,&local_90);
  if (local_60.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_60.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    tv = 0.0;
  }
  else {
    tv = (local_60.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data
         ._M_start)->mVal;
  }
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_60);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_90);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_78);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_d8,&Ie);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_f0,p);
  operator|(&local_c0,&local_d8,&local_f0);
  std::vector<Blade,_std::allocator<Blade>_>::vector(&local_108,&Ie);
  operator|(&local_a8,&local_c0,&local_108);
  operator/(&local_48,&local_a8,tv);
  local_28.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_28.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
             _M_start;
  local_28.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data
              ._M_finish;
  (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (p->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_48.super__Vector_base<Blade,_std::allocator<Blade>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_28);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_48);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_a8);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_108);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_c0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_f0);
  std::vector<Blade,_std::allocator<Blade>_>::~vector(&local_d8);
  return;
}

Assistant:

void CtoE(Clifford &p)
{
  float n;n<=(p|e);
  p=(Ie|p|Ie)/n;
}